

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_id.cc
# Opt level: O2

void InitLookupCell(int level,int i,int j,int orig_orientation,int pos,int orientation)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  
  for (iVar2 = level + 1; iVar2 != 5; iVar2 = iVar2 + 1) {
    lVar3 = (long)orientation * 0x10;
    uVar1 = *(uint *)(S2::internal::kPosToIJ + lVar3 + 4);
    InitLookupCell(iVar2,((int)*(uint *)(S2::internal::kPosToIJ + lVar3) >> 1) + i * 2,
                   (*(uint *)(S2::internal::kPosToIJ + lVar3) & 1) + j * 2,orig_orientation,pos * 4,
                   orientation ^ 1);
    InitLookupCell(iVar2,((int)uVar1 >> 1) + i * 2,(uVar1 & 1) + j * 2,orig_orientation,pos * 4 + 1,
                   orientation);
    InitLookupCell(iVar2,((int)*(uint *)(S2::internal::kPosToIJ + lVar3 + 8) >> 1) + i * 2,
                   (*(uint *)(S2::internal::kPosToIJ + lVar3 + 8) & 1) + j * 2,orig_orientation,
                   pos * 4 + 2,orientation);
    i = ((int)*(uint *)(S2::internal::kPosToIJ + lVar3 + 0xc) >> 1) + i * 2;
    j = (*(uint *)(S2::internal::kPosToIJ + lVar3 + 0xc) & 1) + j * 2;
    pos = pos * 4 + 3;
    orientation = orientation ^ 3;
  }
  iVar2 = i * 0x40 + j * 4;
  lookup_pos[iVar2 + orig_orientation] = (short)orientation + (short)pos * 4;
  lookup_ij[orig_orientation + pos * 4] = (short)iVar2 + (short)orientation;
  return;
}

Assistant:

static void InitLookupCell(int level, int i, int j, int orig_orientation,
                           int pos, int orientation) {
  if (level == kLookupBits) {
    int ij = (i << kLookupBits) + j;
    lookup_pos[(ij << 2) + orig_orientation] = (pos << 2) + orientation;
    lookup_ij[(pos << 2) + orig_orientation] = (ij << 2) + orientation;
  } else {
    level++;
    i <<= 1;
    j <<= 1;
    pos <<= 2;
    const int* r = kPosToIJ[orientation];
    InitLookupCell(level, i + (r[0] >> 1), j + (r[0] & 1), orig_orientation,
                   pos, orientation ^ kPosToOrientation[0]);
    InitLookupCell(level, i + (r[1] >> 1), j + (r[1] & 1), orig_orientation,
                   pos + 1, orientation ^ kPosToOrientation[1]);
    InitLookupCell(level, i + (r[2] >> 1), j + (r[2] & 1), orig_orientation,
                   pos + 2, orientation ^ kPosToOrientation[2]);
    InitLookupCell(level, i + (r[3] >> 1), j + (r[3] & 1), orig_orientation,
                   pos + 3, orientation ^ kPosToOrientation[3]);
  }
}